

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

void __thiscall
MakefileGenerator::writeInstalls(MakefileGenerator *this,QTextStream *t,bool noBuild)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  const_iterator cVar7;
  qsizetype qVar8;
  ulong uVar9;
  iterator o;
  char *pcVar10;
  char *pcVar11;
  const_reference pQVar12;
  char *pcVar13;
  QTextStream *pQVar14;
  QTextStream *pQVar15;
  byte in_DL;
  QTextStream *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int i_1;
  ProStringList *dirs;
  ProStringList *deps;
  int x;
  bool noStrip;
  bool is_target;
  int i;
  int slsh;
  bool do_default;
  ProStringList *installConfigValues;
  ProStringList *l;
  QString tmp_dst_1;
  ConstIterator pit;
  QString targ;
  ConstIterator dep_it;
  QString puninst;
  QString target;
  QString cmd_2;
  QString dst_file_2;
  QFileInfo fi_1;
  QString file;
  QString cmd_1;
  QString dst_file_1;
  QStringList files;
  QString local_dirstr;
  QString sedArgs;
  QString cmd;
  QString dst_file;
  QFileInfo fi;
  QString subd;
  QString tmp_dst;
  QString dir_sfx;
  QString dst_dir;
  QString filestr;
  QString dirstr;
  QString wild;
  Iterator wild_it;
  QString base_path;
  ProStringList tmp2;
  QStringList uninst;
  QStringList inst;
  QStringList tmp;
  QString dst;
  QString root;
  ProKey pvar;
  ConstIterator it;
  QSet<QString> removed_dirs;
  QSet<QString> made_dirs;
  QString all_uninstalls;
  QString all_installs;
  QString rm_dir_contents;
  undefined4 in_stack_ffffffffffffe788;
  FileFixifyType in_stack_ffffffffffffe78c;
  QMakeProject *in_stack_ffffffffffffe790;
  QMakeProject *in_stack_ffffffffffffe798;
  QStringBuilder<QString_&,_QString_&> *in_stack_ffffffffffffe7a0;
  ProKey *var;
  QMakeProject *in_stack_ffffffffffffe7a8;
  MakefileGenerator *this_00;
  MakefileGenerator *in_stack_ffffffffffffe7b0;
  QString *pQVar16;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
  *in_stack_ffffffffffffe7b8;
  MakefileGenerator *in_stack_ffffffffffffe7c0;
  char *in_stack_ffffffffffffe7c8;
  QTextStream *in_stack_ffffffffffffe7e8;
  QString *in_stack_ffffffffffffe7f8;
  ProKey *in_stack_ffffffffffffe800;
  MakefileGenerator *in_stack_ffffffffffffe808;
  long in_stack_ffffffffffffe830;
  QString *in_stack_ffffffffffffe838;
  undefined7 in_stack_ffffffffffffe840;
  byte in_stack_ffffffffffffe847;
  undefined7 in_stack_ffffffffffffe860;
  byte in_stack_ffffffffffffe867;
  long in_stack_ffffffffffffe868;
  undefined7 in_stack_ffffffffffffe870;
  byte in_stack_ffffffffffffe877;
  MakefileGenerator *in_stack_ffffffffffffe878;
  byte local_176c;
  bool local_1769;
  int local_1704;
  int local_16d8;
  int local_16c8;
  bool local_16b5;
  undefined1 local_1680 [120];
  undefined1 local_1608 [48];
  QStringBuilder<const_char_(&)[11],_const_ProString_&> local_15d8;
  undefined1 local_1550 [24];
  undefined1 local_1538 [48];
  undefined1 local_1508 [56];
  undefined8 local_14d0;
  undefined8 local_14c8;
  undefined8 local_14c0;
  const_iterator local_14b8;
  undefined1 local_14b0 [48];
  QStringBuilder<const_ProString_&,_const_char_(&)[8]> local_1480;
  undefined1 local_1470 [48];
  undefined8 local_1440;
  undefined8 local_1438;
  undefined8 local_1430;
  const_iterator local_1428;
  QStringBuilder<const_ProString_&,_const_char_(&)[9]> local_1420;
  QChar local_13c2;
  QStringBuilder<const_ProString_&,_const_char_(&)[11]> local_13c0;
  undefined8 local_1380;
  undefined8 local_1378;
  undefined8 local_1370;
  undefined1 local_1338 [24];
  undefined1 local_1320 [12];
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_ffffffffffffecec;
  undefined8 local_1308;
  undefined8 local_1300;
  undefined8 local_12f8;
  QStringBuilder<QString_&,_QString_&> local_12e8;
  undefined1 local_12a8 [24];
  undefined1 local_1290 [24];
  undefined1 local_1278 [48];
  undefined1 local_1248 [352];
  undefined1 local_10e8 [24];
  QStringBuilder<QString_&,_QString_&> local_10d0;
  undefined8 local_ff8;
  undefined8 local_ff0;
  undefined8 local_fe8;
  undefined8 local_fa8;
  undefined8 local_fa0;
  undefined8 local_f98;
  QStringBuilder<QString_&,_QString_&> local_f90;
  undefined8 local_f68 [2];
  QStringBuilder<QString_&,_QString_&> local_f58;
  undefined1 local_f18 [24];
  undefined1 local_f00 [24];
  QStringBuilder<QString_&,_const_char_(&)[2]> local_ee8;
  undefined8 local_e98;
  undefined8 local_e90;
  undefined8 local_e88;
  QStringBuilder<QString_&,_QString_&> local_e78;
  undefined1 local_e38 [24];
  undefined1 local_e20 [24];
  QStringBuilder<QString_&,_const_char_(&)[2]> local_e08;
  undefined1 local_db8 [24];
  undefined1 local_da0 [160];
  QLatin1String *local_d00;
  QLatin1String *local_cf0;
  QString local_ce0;
  undefined8 local_cc8;
  undefined8 local_cc0;
  undefined8 local_cb8;
  undefined1 local_ca8 [24];
  QDir local_c90 [8];
  QList<QString> local_c88;
  undefined8 local_c70;
  undefined8 local_c68;
  undefined8 local_c60;
  QStringBuilder<QString_&,_QString_&> local_c50;
  undefined1 local_c10 [24];
  undefined1 local_bf8 [24];
  QStringBuilder<QString_&,_const_char_(&)[2]> local_be0;
  QStringBuilder<QString_&,_QString_&> local_b88;
  undefined1 local_b48 [24];
  undefined1 local_b30 [24];
  undefined1 local_b18 [48];
  undefined1 local_ae8 [352];
  undefined1 local_988 [24];
  undefined1 local_970 [31];
  undefined1 local_951;
  QStringBuilder<const_char_(&)[8],_QString_&> local_950;
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined1 local_8c8 [24];
  undefined1 local_8b0 [160];
  QLatin1String *local_810;
  QLatin1String *local_800;
  QString local_7f0 [2];
  undefined8 local_7c0;
  undefined8 local_7b8;
  undefined8 local_7b0;
  undefined8 local_790 [5];
  undefined1 local_768 [48];
  undefined1 local_738 [48];
  undefined1 local_708 [24];
  undefined1 local_6f0 [128];
  undefined8 local_670;
  undefined8 local_668;
  undefined8 local_660;
  char16_t local_652;
  undefined8 local_618;
  undefined8 local_610;
  undefined8 local_608;
  undefined8 local_5f0;
  undefined8 local_5e8;
  undefined8 local_5e0;
  QString local_5c0 [3];
  QString local_578 [2];
  undefined8 local_548;
  undefined8 local_540;
  undefined8 local_538;
  undefined8 local_530;
  undefined8 local_528;
  undefined8 local_520;
  QString local_518;
  iterator local_500 [4];
  QStringBuilder<const_ProString_&,_const_char_(&)[6]> local_4e0;
  QString local_470 [4];
  QStringBuilder<const_ProString_&,_const_char_(&)[7]> local_408;
  QChar local_392 [13];
  QStringBuilder<const_ProString_&,_const_char_(&)[10]> local_378;
  QStringBuilder<const_ProString_&,_const_char_(&)[7]> local_338;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  QList<QString> local_2e0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  QString local_230;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 local_208;
  QStringBuilder<const_ProString_&,_const_char_(&)[8]> local_1e8;
  QStringBuilder<const_ProString_&,_const_char_(&)[6]> local_1a8;
  undefined1 local_198 [48];
  const_iterator local_168 [7];
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_f0 = 0xaaaaaaaaaaaaaaaa;
  local_e8 = 0xaaaaaaaaaaaaaaaa;
  local_e0 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)in_stack_ffffffffffffe798,in_stack_ffffffffffffe7c8);
  bVar3 = isWindowsShell((MakefileGenerator *)in_stack_ffffffffffffe798);
  local_176c = in_stack_ffffffffffffe877;
  if (!bVar3) {
    QString::operator=((QString *)in_stack_ffffffffffffe798,(char *)in_stack_ffffffffffffe7b8);
    local_176c = in_stack_ffffffffffffe877;
  }
  local_108 = 0xaaaaaaaaaaaaaaaa;
  local_100 = 0xaaaaaaaaaaaaaaaa;
  local_f8 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x1877a7);
  local_120 = 0xaaaaaaaaaaaaaaaa;
  local_118 = 0xaaaaaaaaaaaaaaaa;
  local_110 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x1877e1);
  local_128 = 0xaaaaaaaaaaaaaaaa;
  QSet<QString>::QSet((QSet<QString> *)0x1877fd);
  local_130 = 0xaaaaaaaaaaaaaaaa;
  QSet<QString>::QSet((QSet<QString> *)0x187819);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffe790,
                 (char *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
  QMakeProject::values
            (in_stack_ffffffffffffe790,
             (ProKey *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
  ProKey::~ProKey((ProKey *)0x187880);
  local_168[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_168[0] = QList<ProString>::begin((QList<ProString> *)in_stack_ffffffffffffe790);
  do {
    cVar7 = QList<ProString>::end((QList<ProString> *)in_stack_ffffffffffffe790);
    bVar3 = QList<ProString>::const_iterator::operator!=(local_168,cVar7);
    if (!bVar3) {
      pQVar14 = (QTextStream *)QTextStream::operator<<(in_RSI,"install:");
      ProKey::ProKey((ProKey *)pQVar14,
                     (char *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
      pQVar16 = (QString *)local_1608;
      depVar((MakefileGenerator *)in_stack_ffffffffffffe7a8,(ProKey *)in_stack_ffffffffffffe7a0);
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar14,pQVar16);
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,' ');
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,(QString *)&local_108);
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15," FORCE\n\nuninstall: ");
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,(QString *)&local_120);
      this_00 = (MakefileGenerator *)local_1680;
      ProKey::ProKey((ProKey *)pQVar14,
                     (char *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
      var = (ProKey *)(local_1680 + 0x30);
      depVar(this_00,var);
      pQVar14 = (QTextStream *)QTextStream::operator<<(pQVar15,(QString *)var);
      QTextStream::operator<<(pQVar14," FORCE\n\n");
      QString::~QString((QString *)0x18b080);
      ProKey::~ProKey((ProKey *)0x18b08a);
      QString::~QString((QString *)0x18b094);
      ProKey::~ProKey((ProKey *)0x18b09e);
      QSet<QString>::~QSet((QSet<QString> *)0x18b0ab);
      QSet<QString>::~QSet((QSet<QString> *)0x18b0b8);
      QString::~QString((QString *)0x18b0c2);
      QString::~QString((QString *)0x18b0cc);
      QString::~QString((QString *)0x18b0d9);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    memset(local_198,0xaa,0x30);
    QList<ProString>::const_iterator::operator*(local_168);
    local_1a8 = ::operator+((ProString *)in_stack_ffffffffffffe790,
                            (char (*) [6])
                            CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
    ProKey::ProKey<ProString_const&,char_const(&)[6]>
              ((ProKey *)in_stack_ffffffffffffe790,
               (QStringBuilder<const_ProString_&,_const_char_(&)[6]> *)
               CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
    QList<ProString>::const_iterator::operator*(local_168);
    local_1e8 = ::operator+((ProString *)in_stack_ffffffffffffe790,
                            (char (*) [8])
                            CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
    ProKey::ProKey<ProString_const&,char_const(&)[8]>
              ((ProKey *)in_stack_ffffffffffffe790,
               (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)
               CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
    QMakeProject::values
              (in_stack_ffffffffffffe790,
               (ProKey *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
    ProKey::~ProKey((ProKey *)0x1879d3);
    qVar8 = QListSpecialMethodsBase<ProString>::indexOf<char[8]>
                      ((QListSpecialMethodsBase<ProString> *)in_stack_ffffffffffffe790,
                       (char (*) [8])CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788),
                       0x1879fb);
    if ((qVar8 == -1) &&
       (qVar8 = QListSpecialMethodsBase<ProString>::indexOf<char[14]>
                          ((QListSpecialMethodsBase<ProString> *)in_stack_ffffffffffffe790,
                           (char (*) [14])
                           CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788),0x187a1d),
       qVar8 == -1)) {
      QMakeProject::values
                (in_stack_ffffffffffffe790,
                 (ProKey *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
      bVar3 = QList<ProString>::isEmpty((QList<ProString> *)0x187a47);
      if (!bVar3) goto LAB_00187aa2;
      ProString::toLatin1((ProString *)in_stack_ffffffffffffe7a8);
      pcVar13 = QByteArray::constData((QByteArray *)0x187a6f);
      warn_msg(WarnLogic,"%s is not defined: install target not created\n",pcVar13);
      QByteArray::~QByteArray((QByteArray *)0x187a92);
    }
    else {
LAB_00187aa2:
      local_218 = 0xaaaaaaaaaaaaaaaa;
      local_210 = 0xaaaaaaaaaaaaaaaa;
      local_208 = 0xaaaaaaaaaaaaaaaa;
      (**(code **)(*in_RDI + 0x98))(&local_218);
      local_230.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_230.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_230.d.size = -0x5555555555555556;
      QString::QString((QString *)0x187b2a);
      qVar8 = QListSpecialMethodsBase<ProString>::indexOf<char[8]>
                        ((QListSpecialMethodsBase<ProString> *)in_stack_ffffffffffffe790,
                         (char (*) [8])CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788)
                         ,0x187b42);
      if ((qVar8 == -1) &&
         (qVar8 = QListSpecialMethodsBase<ProString>::indexOf<char[14]>
                            ((QListSpecialMethodsBase<ProString> *)in_stack_ffffffffffffe790,
                             (char (*) [14])
                             CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788),0x187b64)
         , qVar8 == -1)) {
        QMakeEvaluator::first
                  (&in_stack_ffffffffffffe7a8->super_QMakeEvaluator,
                   (ProKey *)in_stack_ffffffffffffe7a0);
        ProString::toQString
                  ((ProString *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
        QFlags<MakefileGenerator::FileFixifyType>::QFlags
                  ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffe790,
                   in_stack_ffffffffffffe78c);
        fileFixify((MakefileGenerator *)
                   CONCAT17(in_stack_ffffffffffffe847,in_stack_ffffffffffffe840),
                   in_stack_ffffffffffffe838,(FileFixifyTypes)in_stack_ffffffffffffecec.i,
                   SUB81((ulong)in_stack_ffffffffffffe830 >> 0x38,0));
        QString::operator=((QString *)in_stack_ffffffffffffe790,
                           (QString *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788))
        ;
        QString::~QString((QString *)0x187c02);
        QString::~QString((QString *)0x187c0f);
        ProString::~ProString((ProString *)0x187c1c);
        uVar9 = QString::endsWith((QString *)&local_230,0x3bdbd8);
        if ((uVar9 & 1) == 0) {
          QString::operator+=((QString *)in_stack_ffffffffffffe790,
                              (QString *)
                              CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
        }
      }
      local_2b0 = 0xaaaaaaaaaaaaaaaa;
      local_2a8 = 0xaaaaaaaaaaaaaaaa;
      local_2a0 = 0xaaaaaaaaaaaaaaaa;
      QList<QString>::QList((QList<QString> *)0x187c89);
      local_2c8 = 0xaaaaaaaaaaaaaaaa;
      local_2c0 = 0xaaaaaaaaaaaaaaaa;
      local_2b8 = 0xaaaaaaaaaaaaaaaa;
      QList<QString>::QList((QList<QString> *)0x187cc3);
      local_2e0.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_2e0.d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
      local_2e0.d.size = -0x5555555555555556;
      QList<QString>::QList((QList<QString> *)0x187cfd);
      local_2f8 = 0xaaaaaaaaaaaaaaaa;
      local_2f0 = 0xaaaaaaaaaaaaaaaa;
      local_2e8 = 0xaaaaaaaaaaaaaaaa;
      QList<ProString>::const_iterator::operator*(local_168);
      local_338 = ::operator+((ProString *)in_stack_ffffffffffffe790,
                              (char (*) [7])
                              CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
      ProKey::ProKey<ProString_const&,char_const(&)[7]>
                ((ProKey *)in_stack_ffffffffffffe790,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)
                 CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
      QMakeProject::values
                (in_stack_ffffffffffffe790,
                 (ProKey *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
      ProStringList::ProStringList
                ((ProStringList *)in_stack_ffffffffffffe790,
                 (ProStringList *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
      ProKey::~ProKey((ProKey *)0x187db4);
      bVar3 = QList<ProString>::isEmpty((QList<ProString> *)0x187dc1);
      if (bVar3) {
        QList<ProString>::const_iterator::operator*(local_168);
        local_378 = ::operator+((ProString *)in_stack_ffffffffffffe790,
                                (char (*) [10])
                                CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
        ProKey::ProKey<ProString_const&,char_const(&)[10]>
                  ((ProKey *)in_stack_ffffffffffffe790,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[10]> *)
                   CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
        QMakeProject::values
                  (in_stack_ffffffffffffe790,
                   (ProKey *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
        ProStringList::operator=
                  ((ProStringList *)in_stack_ffffffffffffe790,
                   (ProStringList *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
        ProKey::~ProKey((ProKey *)0x187e54);
      }
      bVar3 = QList<ProString>::isEmpty((QList<ProString> *)0x187e61);
      if (!bVar3) {
        QChar::QChar<char,_true>(local_392,' ');
        ProStringList::join((ProStringList *)
                            CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788),
                            (QChar)(char16_t)((ulong)in_stack_ffffffffffffe798 >> 0x30));
        QList<QString>::operator<<
                  ((QList<QString> *)in_stack_ffffffffffffe790,
                   (rvalue_ref)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
        QString::~QString((QString *)0x187ebe);
      }
      local_16b5 = bVar3;
      QList<ProString>::const_iterator::operator*(local_168);
      local_408 = ::operator+((ProString *)in_stack_ffffffffffffe790,
                              (char (*) [7])
                              CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
      ProKey::ProKey<ProString_const&,char_const(&)[7]>
                ((ProKey *)in_stack_ffffffffffffe790,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)
                 CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
      QMakeProject::values
                (in_stack_ffffffffffffe790,
                 (ProKey *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
      ProStringList::ProStringList
                ((ProStringList *)in_stack_ffffffffffffe790,
                 (ProStringList *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
      QString::QString((QString *)in_stack_ffffffffffffe798,in_stack_ffffffffffffe7c8);
      findFilesInVPATH(in_stack_ffffffffffffe878,
                       (ProStringList *)CONCAT17(local_176c,in_stack_ffffffffffffe870),
                       (uchar)((ulong)in_stack_ffffffffffffe868 >> 0x38),
                       (QString *)CONCAT17(in_stack_ffffffffffffe867,in_stack_ffffffffffffe860));
      ProStringList::operator=
                ((ProStringList *)in_stack_ffffffffffffe790,
                 (ProStringList *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
      ProStringList::~ProStringList((ProStringList *)0x187f9b);
      QString::~QString((QString *)0x187fa8);
      ProStringList::~ProStringList((ProStringList *)0x187fb5);
      ProKey::~ProKey((ProKey *)0x187fc2);
      ProStringList::toQStringList((ProStringList *)in_stack_ffffffffffffe7b0);
      QFlags<MakefileGenerator::FileFixifyType>::QFlags
                ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffe790,
                 in_stack_ffffffffffffe78c);
      fileFixify(in_stack_ffffffffffffe7b0,(QStringList *)in_stack_ffffffffffffe7a8,
                 (QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>)
                 SUB84((ulong)in_stack_ffffffffffffe7e8 >> 0x20,0),
                 SUB81((ulong)in_stack_ffffffffffffe7a0 >> 0x38,0));
      QList<QString>::operator=
                ((QList<QString> *)in_stack_ffffffffffffe790,
                 (QList<QString> *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
      QList<QString>::~QList((QList<QString> *)0x188035);
      QList<QString>::~QList((QList<QString> *)0x188042);
      bVar3 = QList<QString>::isEmpty((QList<QString> *)0x18804f);
      if (!bVar3) {
        local_16b5 = false;
        local_470[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_470[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        local_470[0].d.size = -0x5555555555555556;
        QList<ProString>::const_iterator::operator*(local_168);
        local_4e0 = ::operator+((ProString *)in_stack_ffffffffffffe790,
                                (char (*) [6])
                                CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
        ProKey::ProKey<ProString_const&,char_const(&)[6]>
                  ((ProKey *)in_stack_ffffffffffffe790,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[6]> *)
                   CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
        QMakeEvaluator::first
                  (&in_stack_ffffffffffffe7a8->super_QMakeEvaluator,
                   (ProKey *)in_stack_ffffffffffffe7a0);
        ProString::toQString
                  ((ProString *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
        ProString::~ProString((ProString *)0x188123);
        ProKey::~ProKey((ProKey *)0x188130);
        bVar3 = QString::isEmpty((QString *)0x18813d);
        if (!bVar3) {
          Option::fixPathToTargetOS
                    ((QString *)in_stack_ffffffffffffe7a8,
                     SUB81((ulong)in_stack_ffffffffffffe7a0 >> 0x38,0),
                     SUB81((ulong)in_stack_ffffffffffffe7a0 >> 0x30,0));
          QString::operator=((QString *)in_stack_ffffffffffffe790,
                             (QString *)
                             CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
          QString::~QString((QString *)0x18817f);
          uVar9 = QString::endsWith((QString *)local_470,0x3bdbd8);
          if ((uVar9 & 1) == 0) {
            QString::operator+=((QString *)in_stack_ffffffffffffe790,
                                (QString *)
                                CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
          }
        }
        local_500[0].i = (QString *)0xaaaaaaaaaaaaaaaa;
        local_500[0] = QList<QString>::begin((QList<QString> *)in_stack_ffffffffffffe790);
        while( true ) {
          o = QList<QString>::end((QList<QString> *)in_stack_ffffffffffffe790);
          bVar3 = QList<QString>::iterator::operator!=(local_500,o);
          if (!bVar3) break;
          local_518.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_518.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          local_518.d.size = -0x5555555555555556;
          QList<QString>::iterator::operator*(local_500);
          Option::fixPathToTargetOS
                    ((QString *)in_stack_ffffffffffffe7a8,
                     SUB81((ulong)in_stack_ffffffffffffe7a0 >> 0x38,0),
                     SUB81((ulong)in_stack_ffffffffffffe7a0 >> 0x30,0));
          local_530 = 0xaaaaaaaaaaaaaaaa;
          local_528 = 0xaaaaaaaaaaaaaaaa;
          local_520 = 0xaaaaaaaaaaaaaaaa;
          qmake_getpwd();
          local_548 = 0xaaaaaaaaaaaaaaaa;
          local_540 = 0xaaaaaaaaaaaaaaaa;
          local_538 = 0xaaaaaaaaaaaaaaaa;
          QString::QString((QString *)in_stack_ffffffffffffe790,
                           (QString *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788))
          ;
          qVar8 = QString::lastIndexOf
                            ((QString *)in_stack_ffffffffffffe7a0,
                             (QString *)in_stack_ffffffffffffe798,
                             (CaseSensitivity)((ulong)in_stack_ffffffffffffe790 >> 0x20));
          if ((int)qVar8 != -1) {
            QString::left((QString *)in_stack_ffffffffffffe7a8,(qsizetype)in_stack_ffffffffffffe7a0)
            ;
            QString::operator=((QString *)in_stack_ffffffffffffe790,
                               (QString *)
                               CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
            QString::~QString((QString *)0x188341);
            QString::remove((longlong)&local_548,0);
          }
          uVar9 = QString::endsWith((QString *)&local_530,0x3bdbd8);
          if ((uVar9 & 1) == 0) {
            QString::operator+=((QString *)in_stack_ffffffffffffe790,
                                (QString *)
                                CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
          }
          local_578[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_578[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          local_578[0].d.size = -0x5555555555555556;
          QString::QString((QString *)in_stack_ffffffffffffe790,
                           (QString *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788))
          ;
          bVar3 = QString::isEmpty((QString *)0x1883df);
          if (!bVar3) {
            uVar9 = QString::startsWith((QString *)&local_530,(CaseSensitivity)local_470);
            if ((uVar9 & 1) == 0) {
              QtPrivate::asString(&local_518);
              QString::toLocal8Bit((QString *)in_stack_ffffffffffffe7a8);
              pcVar13 = QByteArray::constData((QByteArray *)0x188433);
              QList<ProString>::const_iterator::operator*(local_168);
              ProString::toQString
                        ((ProString *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788))
              ;
              QtPrivate::asString(local_5c0);
              QString::toLocal8Bit((QString *)in_stack_ffffffffffffe7a8);
              pcVar10 = QByteArray::constData((QByteArray *)0x188482);
              QtPrivate::asString(local_470);
              QString::toLocal8Bit((QString *)in_stack_ffffffffffffe7a8);
              pcVar11 = QByteArray::constData((QByteArray *)0x1884b4);
              warn_msg(WarnLogic,"File %s in install rule %s does not start with base %s",pcVar13,
                       pcVar10,pcVar11);
              QByteArray::~QByteArray((QByteArray *)0x1884e7);
              QByteArray::~QByteArray((QByteArray *)0x1884f4);
              QString::~QString((QString *)0x188501);
              QByteArray::~QByteArray((QByteArray *)0x18850e);
            }
            else {
              local_5f0 = 0xaaaaaaaaaaaaaaaa;
              local_5e8 = 0xaaaaaaaaaaaaaaaa;
              local_5e0 = 0xaaaaaaaaaaaaaaaa;
              QString::size(local_470);
              QString::mid((longlong)&local_5f0,(longlong)&local_530);
              QString::operator+=((QString *)in_stack_ffffffffffffe790,
                                  (QString *)
                                  CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              bVar3 = QString::isEmpty((QString *)0x18858e);
              if ((!bVar3) &&
                 (bVar3 = QSet<QString>::contains
                                    ((QSet<QString> *)in_stack_ffffffffffffe790,
                                     (QString *)
                                     CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788)),
                 !bVar3)) {
                QSet<QString>::insert
                          ((QSet<QString> *)in_stack_ffffffffffffe7a8,
                           (QString *)in_stack_ffffffffffffe7a0);
                local_618 = 0xaaaaaaaaaaaaaaaa;
                local_610 = 0xaaaaaaaaaaaaaaaa;
                local_608 = 0xaaaaaaaaaaaaaaaa;
                QFlags<MakefileGenerator::FileFixifyType>::QFlags
                          ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffe790,
                           in_stack_ffffffffffffe78c);
                fileFixify((MakefileGenerator *)
                           CONCAT17(in_stack_ffffffffffffe847,in_stack_ffffffffffffe840),
                           in_stack_ffffffffffffe838,(FileFixifyTypes)in_stack_ffffffffffffecec.i,
                           SUB81((ulong)in_stack_ffffffffffffe830 >> 0x38,0));
                QString::chop((longlong)&local_618);
                filePrefixRoot((MakefileGenerator *)in_stack_ffffffffffffe7a8,
                               (QString *)in_stack_ffffffffffffe7a0,
                               (QString *)in_stack_ffffffffffffe798);
                mkdir_p_asstring(in_stack_ffffffffffffe7b0,(QString *)in_stack_ffffffffffffe7a8,
                                 SUB81((ulong)in_stack_ffffffffffffe7a0 >> 0x38,0));
                QList<QString>::operator<<
                          ((QList<QString> *)in_stack_ffffffffffffe790,
                           (rvalue_ref)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788)
                          );
                QString::~QString((QString *)0x1886b1);
                QString::~QString((QString *)0x1886be);
                qVar8 = QString::size(&local_230);
                for (local_16c8 = (int)qVar8; qVar8 = QString::size(local_578), local_16c8 < qVar8;
                    local_16c8 = local_16c8 + 1) {
                  local_652 = (char16_t)
                              QString::at((QString *)in_stack_ffffffffffffe798,
                                          (qsizetype)in_stack_ffffffffffffe790);
                  bVar3 = ::operator==((QChar *)in_stack_ffffffffffffe790,
                                       (QString *)
                                       CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788)
                                      );
                  if (bVar3) {
                    local_670 = 0xaaaaaaaaaaaaaaaa;
                    local_668 = 0xaaaaaaaaaaaaaaaa;
                    local_660 = 0xaaaaaaaaaaaaaaaa;
                    QString::left((QString *)in_stack_ffffffffffffe7a8,
                                  (qsizetype)in_stack_ffffffffffffe7a0);
                    bVar3 = QSet<QString>::contains
                                      ((QSet<QString> *)in_stack_ffffffffffffe790,
                                       (QString *)
                                       CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788)
                                      );
                    if (!bVar3) {
                      QSet<QString>::insert
                                ((QSet<QString> *)in_stack_ffffffffffffe7a8,
                                 (QString *)in_stack_ffffffffffffe7a0);
                      QFlags<MakefileGenerator::FileFixifyType>::QFlags
                                ((QFlags<MakefileGenerator::FileFixifyType> *)
                                 in_stack_ffffffffffffe790,in_stack_ffffffffffffe78c);
                      fileFixify((MakefileGenerator *)
                                 CONCAT17(in_stack_ffffffffffffe847,in_stack_ffffffffffffe840),
                                 in_stack_ffffffffffffe838,
                                 (FileFixifyTypes)in_stack_ffffffffffffecec.i,
                                 SUB81((ulong)in_stack_ffffffffffffe830 >> 0x38,0));
                      QString::operator=((QString *)in_stack_ffffffffffffe790,
                                         (QString *)
                                         CONCAT44(in_stack_ffffffffffffe78c,
                                                  in_stack_ffffffffffffe788));
                      QString::~QString((QString *)0x18881c);
                      filePrefixRoot((MakefileGenerator *)in_stack_ffffffffffffe7a8,
                                     (QString *)in_stack_ffffffffffffe7a0,
                                     (QString *)in_stack_ffffffffffffe798);
                      (**(code **)(*in_RDI + 0x60))(local_6f0,in_RDI,local_708);
                      ::operator+((char (*) [13])in_stack_ffffffffffffe798,
                                  (QString *)in_stack_ffffffffffffe790);
                      ::QStringBuilder::operator_cast_to_QString
                                ((QStringBuilder<const_char_(&)[13],_QString> *)
                                 CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
                      QList<QString>::operator<<
                                ((QList<QString> *)in_stack_ffffffffffffe790,
                                 (rvalue_ref)
                                 CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
                      QString::~QString((QString *)0x1888b2);
                      QStringBuilder<const_char_(&)[13],_QString>::~QStringBuilder
                                ((QStringBuilder<const_char_(&)[13],_QString> *)0x1888bf);
                      QString::~QString((QString *)0x1888cc);
                      QString::~QString((QString *)0x1888d9);
                    }
                    QString::~QString((QString *)0x1888e6);
                  }
                }
                QString::~QString((QString *)0x18890b);
              }
              QString::~QString((QString *)0x188918);
            }
          }
          ProKey::ProKey((ProKey *)in_stack_ffffffffffffe790,
                         (char *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
          (**(code **)(*in_RDI + 0xb0))(local_738,in_RDI,local_768);
          QFlags<MakefileGenerator::FileFixifyType>::QFlags
                    ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffe790,
                     in_stack_ffffffffffffe78c);
          fileFixify((MakefileGenerator *)
                     CONCAT17(in_stack_ffffffffffffe847,in_stack_ffffffffffffe840),
                     in_stack_ffffffffffffe838,(FileFixifyTypes)in_stack_ffffffffffffecec.i,
                     SUB81((ulong)in_stack_ffffffffffffe830 >> 0x38,0));
          bVar3 = ::operator==((QString *)in_stack_ffffffffffffe790,
                               (QString *)
                               CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
          QString::~QString((QString *)0x1889b4);
          QString::~QString((QString *)0x1889c1);
          ProKey::~ProKey((ProKey *)0x1889ce);
          bVar4 = ProStringList::contains
                            ((ProStringList *)in_stack_ffffffffffffe7a8,
                             (char *)in_stack_ffffffffffffe7a0,
                             (CaseSensitivity)((ulong)in_stack_ffffffffffffe798 >> 0x20));
          local_1769 = true;
          if (!bVar3) {
            QString::QString((QString *)in_stack_ffffffffffffe790,
                             (QString *)
                             CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
            local_1769 = exists((MakefileGenerator *)in_stack_ffffffffffffe7a8,
                                (QString *)in_stack_ffffffffffffe7a0);
            QString::~QString((QString *)0x188a7d);
          }
          if (local_1769 == false) {
            local_c70 = 0xaaaaaaaaaaaaaaaa;
            local_c68 = 0xaaaaaaaaaaaaaaaa;
            local_c60 = 0xaaaaaaaaaaaaaaaa;
            Option::normalizePath
                      ((QString *)in_stack_ffffffffffffe7a8,
                       SUB81((ulong)in_stack_ffffffffffffe7a0 >> 0x38,0),
                       SUB81((ulong)in_stack_ffffffffffffe7a0 >> 0x30,0));
            local_c88.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_c88.d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
            local_c88.d.size = -0x5555555555555556;
            QDir::QDir(local_c90,(QString *)&local_c70);
            QList<QString>::QList<QString,void>
                      ((QList<QString> *)in_stack_ffffffffffffe790,
                       (QString *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
            operator|((enum_type)((ulong)in_stack_ffffffffffffe790 >> 0x20),
                      (enum_type)in_stack_ffffffffffffe790);
            QFlags<QDir::SortFlag>::QFlags
                      ((QFlags<QDir::SortFlag> *)in_stack_ffffffffffffe790,in_stack_ffffffffffffe78c
                      );
            QDir::entryList((QList_conflict2 *)&local_c88,(QFlags_conflict *)local_c90,
                            (QFlags_conflict *)local_ca8);
            QList<QString>::~QList((QList<QString> *)0x189601);
            QDir::~QDir(local_c90);
            bVar3 = ProStringList::contains
                              ((ProStringList *)in_stack_ffffffffffffe7a8,
                               (char *)in_stack_ffffffffffffe7a0,
                               (CaseSensitivity)((ulong)in_stack_ffffffffffffe798 >> 0x20));
            if ((bVar3) && (bVar3 = QList<QString>::isEmpty((QList<QString> *)0x18963d), bVar3)) {
              local_cc8 = 0xaaaaaaaaaaaaaaaa;
              local_cc0 = 0xaaaaaaaaaaaaaaaa;
              local_cb8 = 0xaaaaaaaaaaaaaaaa;
              filePrefixRoot((MakefileGenerator *)in_stack_ffffffffffffe7a8,
                             (QString *)in_stack_ffffffffffffe7a0,
                             (QString *)in_stack_ffffffffffffe798);
              uVar9 = QString::endsWith((QString *)&local_cc8,0x3bdbd8);
              if ((uVar9 & 1) == 0) {
                QString::operator+=((QString *)in_stack_ffffffffffffe790,
                                    (QString *)
                                    CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              }
              QString::operator+=((QString *)in_stack_ffffffffffffe790,
                                  (QString *)
                                  CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              local_ce0.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_ce0.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              local_ce0.d.size = -0x5555555555555556;
              QString::QString((QString *)0x189718);
              bVar3 = ProStringList::contains
                                ((ProStringList *)in_stack_ffffffffffffe7a8,
                                 (char *)in_stack_ffffffffffffe7a0,
                                 (CaseSensitivity)((ulong)in_stack_ffffffffffffe798 >> 0x20));
              if (bVar3) {
                QLatin1String::QLatin1String
                          ((QLatin1String *)in_stack_ffffffffffffe7a0,
                           (char *)in_stack_ffffffffffffe798);
                QString::operator=(&local_ce0,local_cf0);
              }
              else {
                QLatin1String::QLatin1String
                          ((QLatin1String *)in_stack_ffffffffffffe7a0,
                           (char *)in_stack_ffffffffffffe798);
                QString::operator=(&local_ce0,local_d00);
              }
              (**(code **)(*in_RDI + 0x60))(local_da0,in_RDI,&local_518);
              ::operator+((char (*) [2])in_stack_ffffffffffffe798,
                          (QString *)in_stack_ffffffffffffe790);
              ::operator+((QStringBuilder<const_char_(&)[2],_QString> *)in_stack_ffffffffffffe798,
                          (char (*) [2])in_stack_ffffffffffffe790);
              (**(code **)(*in_RDI + 0x60))(local_db8,in_RDI,&local_cc8);
              ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>
                           *)in_stack_ffffffffffffe798,(QString *)in_stack_ffffffffffffe790);
              ::operator+=((QString *)in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                                 *)in_stack_ffffffffffffe790);
              QString::~QString((QString *)0x18985b);
              QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>::
              ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>
                               *)0x189868);
              QStringBuilder<const_char_(&)[2],_QString>::~QStringBuilder
                        ((QStringBuilder<const_char_(&)[2],_QString> *)0x189875);
              QString::~QString((QString *)0x189882);
              QList<QString>::operator<<
                        ((QList<QString> *)in_stack_ffffffffffffe790,
                         (parameter_type)
                         CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              local_e08 = ::operator+((QString *)in_stack_ffffffffffffe790,
                                      (char (*) [2])
                                      CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788))
              ;
              local_e78 = ::operator+((QString *)in_stack_ffffffffffffe790,
                                      (QString *)
                                      CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788))
              ;
              ::QStringBuilder::operator_cast_to_QString
                        ((QStringBuilder<QString_&,_QString_&> *)
                         CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              QFlags<MakefileGenerator::FileFixifyType>::QFlags
                        ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffe790,
                         in_stack_ffffffffffffe78c);
              fileFixify((MakefileGenerator *)
                         CONCAT17(in_stack_ffffffffffffe847,in_stack_ffffffffffffe840),
                         in_stack_ffffffffffffe838,(FileFixifyTypes)in_stack_ffffffffffffecec.i,
                         SUB81((ulong)in_stack_ffffffffffffe830 >> 0x38,0));
              filePrefixRoot((MakefileGenerator *)in_stack_ffffffffffffe7a8,
                             (QString *)in_stack_ffffffffffffe7a0,
                             (QString *)in_stack_ffffffffffffe798);
              (**(code **)(*in_RDI + 0x60))(local_e20,in_RDI,local_e38);
              ::operator+((QStringBuilder<QString_&,_const_char_(&)[2]> *)in_stack_ffffffffffffe798,
                          (QString *)in_stack_ffffffffffffe790);
              ::QStringBuilder::operator_cast_to_QString
                        ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString> *)
                         CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              QList<QString>::append
                        ((QList<QString> *)in_stack_ffffffffffffe790,
                         (rvalue_ref)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              QString::~QString((QString *)0x1899c5);
              QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>::~QStringBuilder
                        ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString> *)
                         0x1899d2);
              QString::~QString((QString *)0x1899df);
              QString::~QString((QString *)0x1899ec);
              QString::~QString((QString *)0x1899f9);
              QString::~QString((QString *)0x189a06);
              QString::~QString((QString *)0x189a13);
              QString::~QString((QString *)0x189a20);
            }
            local_16d8 = 0;
            while( true ) {
              in_stack_ffffffffffffe868 = (long)local_16d8;
              qVar8 = QList<QString>::size(&local_c88);
              if (qVar8 <= in_stack_ffffffffffffe868) break;
              local_e98 = 0xaaaaaaaaaaaaaaaa;
              local_e90 = 0xaaaaaaaaaaaaaaaa;
              local_e88 = 0xaaaaaaaaaaaaaaaa;
              QList<QString>::operator[]
                        ((QList<QString> *)in_stack_ffffffffffffe790,
                         CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              QString::QString((QString *)in_stack_ffffffffffffe790,
                               (QString *)
                               CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              local_ee8 = ::operator+((QString *)in_stack_ffffffffffffe790,
                                      (char (*) [2])
                                      CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788))
              ;
              local_f58 = ::operator+((QString *)in_stack_ffffffffffffe790,
                                      (QString *)
                                      CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788))
              ;
              ::QStringBuilder::operator_cast_to_QString
                        ((QStringBuilder<QString_&,_QString_&> *)
                         CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              QFlags<MakefileGenerator::FileFixifyType>::QFlags
                        ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffe790,
                         in_stack_ffffffffffffe78c);
              fileFixify((MakefileGenerator *)
                         CONCAT17(in_stack_ffffffffffffe847,in_stack_ffffffffffffe840),
                         in_stack_ffffffffffffe838,(FileFixifyTypes)in_stack_ffffffffffffecec.i,
                         SUB81((ulong)in_stack_ffffffffffffe830 >> 0x38,0));
              filePrefixRoot((MakefileGenerator *)in_stack_ffffffffffffe7a8,
                             (QString *)in_stack_ffffffffffffe7a0,
                             (QString *)in_stack_ffffffffffffe798);
              (**(code **)(*in_RDI + 0x60))(local_f00,in_RDI,local_f18);
              ::operator+((QStringBuilder<QString_&,_const_char_(&)[2]> *)in_stack_ffffffffffffe798,
                          (QString *)in_stack_ffffffffffffe790);
              ::QStringBuilder::operator_cast_to_QString
                        ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString> *)
                         CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              QList<QString>::append
                        ((QList<QString> *)in_stack_ffffffffffffe790,
                         (rvalue_ref)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              QString::~QString((QString *)0x189bdc);
              QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>::~QStringBuilder
                        ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString> *)
                         0x189be9);
              QString::~QString((QString *)0x189bf6);
              QString::~QString((QString *)0x189c03);
              QString::~QString((QString *)0x189c10);
              QString::~QString((QString *)0x189c1d);
              local_f68[0] = 0xaaaaaaaaaaaaaaaa;
              local_f90 = ::operator+((QString *)in_stack_ffffffffffffe790,
                                      (QString *)
                                      CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788))
              ;
              ::QStringBuilder::operator_cast_to_QString
                        ((QStringBuilder<QString_&,_QString_&> *)
                         CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              fileInfo(in_stack_ffffffffffffe7c0,(QString *)in_stack_ffffffffffffe7b8);
              QString::~QString((QString *)0x189c90);
              local_fa8 = 0xaaaaaaaaaaaaaaaa;
              local_fa0 = 0xaaaaaaaaaaaaaaaa;
              local_f98 = 0xaaaaaaaaaaaaaaaa;
              QFlags<MakefileGenerator::FileFixifyType>::QFlags
                        ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffe790,
                         in_stack_ffffffffffffe78c);
              fileFixify((MakefileGenerator *)
                         CONCAT17(in_stack_ffffffffffffe847,in_stack_ffffffffffffe840),
                         in_stack_ffffffffffffe838,(FileFixifyTypes)in_stack_ffffffffffffecec.i,
                         SUB81((ulong)in_stack_ffffffffffffe830 >> 0x38,0));
              filePrefixRoot((MakefileGenerator *)in_stack_ffffffffffffe7a8,
                             (QString *)in_stack_ffffffffffffe7a0,
                             (QString *)in_stack_ffffffffffffe798);
              QString::~QString((QString *)0x189d28);
              uVar9 = QString::endsWith((QString *)&local_fa8,0x3bdbd8);
              if ((uVar9 & 1) == 0) {
                QString::operator+=((QString *)in_stack_ffffffffffffe790,
                                    (QString *)
                                    CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              }
              QFileInfo::fileName();
              QString::operator+=((QString *)in_stack_ffffffffffffe790,
                                  (QString *)
                                  CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              QString::~QString((QString *)0x189d90);
              local_ff8 = 0xaaaaaaaaaaaaaaaa;
              local_ff0 = 0xaaaaaaaaaaaaaaaa;
              local_fe8 = 0xaaaaaaaaaaaaaaaa;
              QLatin1String::QLatin1String
                        ((QLatin1String *)in_stack_ffffffffffffe7a0,
                         (char *)in_stack_ffffffffffffe798);
              local_10d0 = ::operator+((QString *)in_stack_ffffffffffffe790,
                                       (QString *)
                                       CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788)
                                      );
              escapeFilePath<QString&,QString&>
                        ((MakefileGenerator *)in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a0);
              ::operator+((QLatin1String *)in_stack_ffffffffffffe798,
                          (QString *)in_stack_ffffffffffffe790);
              ::operator+((QStringBuilder<QLatin1String,_QString> *)in_stack_ffffffffffffe798,
                          (char (*) [2])in_stack_ffffffffffffe790);
              (**(code **)(*in_RDI + 0x60))(local_10e8,in_RDI,&local_fa8);
              ::operator+((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>
                           *)in_stack_ffffffffffffe798,(QString *)in_stack_ffffffffffffe790);
              ::QStringBuilder::operator_cast_to_QString
                        ((QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>,_QString>
                          *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>,_QString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>,_QString>
                                 *)in_stack_ffffffffffffe790);
              QString::~QString((QString *)0x189eb6);
              QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>::
              ~QStringBuilder((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_const_char_(&)[2]>
                               *)0x189ec3);
              QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                        ((QStringBuilder<QLatin1String,_QString> *)0x189ed0);
              QString::~QString((QString *)0x189edd);
              QList<QString>::operator<<
                        ((QList<QString> *)in_stack_ffffffffffffe790,
                         (parameter_type)
                         CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              bVar2 = false;
              bVar1 = false;
              bVar3 = false;
              in_stack_ffffffffffffe847 = 0;
              if (!bVar4) {
                QString::QString((QString *)in_stack_ffffffffffffe798,in_stack_ffffffffffffe7c8);
                bVar2 = true;
                bVar5 = QMakeProject::isActiveConfig
                                  (in_stack_ffffffffffffe798,(QString *)in_stack_ffffffffffffe790,
                                   SUB41(in_stack_ffffffffffffe78c >> 0x18,0));
                in_stack_ffffffffffffe847 = 0;
                if (!bVar5) {
                  QString::QString((QString *)in_stack_ffffffffffffe798,in_stack_ffffffffffffe7c8);
                  bVar1 = true;
                  bVar5 = QMakeProject::isActiveConfig
                                    (in_stack_ffffffffffffe798,(QString *)in_stack_ffffffffffffe790,
                                     SUB41(in_stack_ffffffffffffe78c >> 0x18,0));
                  in_stack_ffffffffffffe847 = 0;
                  if (!bVar5) {
                    uVar6 = QFileInfo::isDir();
                    in_stack_ffffffffffffe847 = 0;
                    if ((uVar6 & 1) == 0) {
                      uVar6 = QFileInfo::isExecutable();
                      in_stack_ffffffffffffe847 = 0;
                      if ((uVar6 & 1) != 0) {
                        ProKey::ProKey((ProKey *)in_stack_ffffffffffffe790,
                                       (char *)CONCAT44(in_stack_ffffffffffffe78c,
                                                        in_stack_ffffffffffffe788));
                        bVar3 = true;
                        bVar5 = QMakeProject::isEmpty
                                          (in_stack_ffffffffffffe7a8,
                                           (ProKey *)in_stack_ffffffffffffe7a0);
                        in_stack_ffffffffffffe847 = bVar5 ^ 0xff;
                      }
                    }
                  }
                }
              }
              in_stack_ffffffffffffe867 = in_stack_ffffffffffffe847;
              if (bVar3) {
                ProKey::~ProKey((ProKey *)0x18a093);
              }
              if (bVar1) {
                QString::~QString((QString *)0x18a0ac);
              }
              if (bVar2) {
                QString::~QString((QString *)0x18a0c5);
              }
              if ((in_stack_ffffffffffffe847 & 1) != 0) {
                QString::QString((QString *)in_stack_ffffffffffffe798,in_stack_ffffffffffffe7c8);
                ProKey::ProKey((ProKey *)in_stack_ffffffffffffe790,
                               (char *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788)
                              );
                (**(code **)(*in_RDI + 0xb0))(local_1248,in_RDI,local_1278);
                ::operator+((QString *)in_stack_ffffffffffffe798,
                            (QString *)in_stack_ffffffffffffe790);
                ::operator+((QStringBuilder<QString,_QString> *)in_stack_ffffffffffffe798,
                            (char (*) [2])in_stack_ffffffffffffe790);
                local_12e8 = ::operator+((QString *)in_stack_ffffffffffffe790,
                                         (QString *)
                                         CONCAT44(in_stack_ffffffffffffe78c,
                                                  in_stack_ffffffffffffe788));
                ::QStringBuilder::operator_cast_to_QString
                          ((QStringBuilder<QString_&,_QString_&> *)
                           CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
                QFlags<MakefileGenerator::FileFixifyType>::QFlags
                          ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffe790,
                           in_stack_ffffffffffffe78c);
                fileFixify((MakefileGenerator *)
                           CONCAT17(in_stack_ffffffffffffe847,in_stack_ffffffffffffe840),
                           in_stack_ffffffffffffe838,(FileFixifyTypes)in_stack_ffffffffffffecec.i,
                           SUB81((ulong)in_stack_ffffffffffffe830 >> 0x38,0));
                filePrefixRoot((MakefileGenerator *)in_stack_ffffffffffffe7a8,
                               (QString *)in_stack_ffffffffffffe7a0,
                               (QString *)in_stack_ffffffffffffe798);
                (**(code **)(*in_RDI + 0x60))(local_1290,in_RDI,local_12a8);
                ::operator+((QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]> *)
                            in_stack_ffffffffffffe798,(QString *)in_stack_ffffffffffffe790);
                ::QStringBuilder::operator_cast_to_QString
                          ((QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                            *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
                QList<QString>::operator<<
                          ((QList<QString> *)in_stack_ffffffffffffe790,
                           (rvalue_ref)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788)
                          );
                QString::~QString((QString *)0x18a261);
                QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                                   *)in_stack_ffffffffffffe790);
                QString::~QString((QString *)0x18a27b);
                QString::~QString((QString *)0x18a288);
                QString::~QString((QString *)0x18a295);
                QString::~QString((QString *)0x18a2a2);
                QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>::~QStringBuilder
                          ((QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]> *)
                           0x18a2af);
                QStringBuilder<QString,_QString>::~QStringBuilder
                          ((QStringBuilder<QString,_QString> *)in_stack_ffffffffffffe790);
                QString::~QString((QString *)0x18a2c9);
                ProKey::~ProKey((ProKey *)0x18a2d6);
                QString::~QString((QString *)0x18a2e3);
              }
              QString::~QString((QString *)0x18a2f0);
              QString::~QString((QString *)0x18a2fd);
              QFileInfo::~QFileInfo((QFileInfo *)local_f68);
              QString::~QString((QString *)0x18a317);
              local_16d8 = local_16d8 + 1;
            }
            QList<QString>::~QList((QList<QString> *)0x18a33a);
            QString::~QString((QString *)0x18a347);
          }
          else {
            local_790[0] = 0xaaaaaaaaaaaaaaaa;
            QString::QString((QString *)in_stack_ffffffffffffe790,
                             (QString *)
                             CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
            fileInfo(in_stack_ffffffffffffe7c0,(QString *)in_stack_ffffffffffffe7b8);
            QString::~QString((QString *)0x188adb);
            local_7c0 = 0xaaaaaaaaaaaaaaaa;
            local_7b8 = 0xaaaaaaaaaaaaaaaa;
            local_7b0 = 0xaaaaaaaaaaaaaaaa;
            filePrefixRoot((MakefileGenerator *)in_stack_ffffffffffffe7a8,
                           (QString *)in_stack_ffffffffffffe7a0,(QString *)in_stack_ffffffffffffe798
                          );
            uVar9 = QString::endsWith((QString *)&local_7c0,0x3bdbd8);
            if ((uVar9 & 1) == 0) {
              QString::operator+=((QString *)in_stack_ffffffffffffe790,
                                  (QString *)
                                  CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
            }
            QFileInfo::fileName();
            QString::operator+=((QString *)in_stack_ffffffffffffe790,
                                (QString *)
                                CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
            QString::~QString((QString *)0x188b95);
            local_7f0[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_7f0[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            local_7f0[0].d.size = -0x5555555555555556;
            QString::QString((QString *)0x188bcf);
            if ((bVar3) ||
               ((uVar9 = QFileInfo::isDir(), (uVar9 & 1) == 0 &&
                (uVar9 = QFileInfo::isExecutable(), (uVar9 & 1) != 0)))) {
              QLatin1String::QLatin1String
                        ((QLatin1String *)in_stack_ffffffffffffe7a0,
                         (char *)in_stack_ffffffffffffe798);
              QString::operator=(local_7f0,local_800);
            }
            else {
              QLatin1String::QLatin1String
                        ((QLatin1String *)in_stack_ffffffffffffe7a0,
                         (char *)in_stack_ffffffffffffe798);
              QString::operator=(local_7f0,local_810);
            }
            (**(code **)(*in_RDI + 0x60))(local_8b0,in_RDI,&local_518);
            ::operator+((char (*) [2])in_stack_ffffffffffffe798,(QString *)in_stack_ffffffffffffe790
                       );
            ::operator+((QStringBuilder<const_char_(&)[2],_QString> *)in_stack_ffffffffffffe798,
                        (char (*) [2])in_stack_ffffffffffffe790);
            (**(code **)(*in_RDI + 0x60))(local_8c8,in_RDI,&local_7c0);
            ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>
                         *)in_stack_ffffffffffffe798,(QString *)in_stack_ffffffffffffe790);
            ::operator+=((QString *)in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
            QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>,_QString>
                               *)in_stack_ffffffffffffe790);
            QString::~QString((QString *)0x188d21);
            QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>::
            ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[2],_QString>,_const_char_(&)[2]>
                             *)0x188d2e);
            QStringBuilder<const_char_(&)[2],_QString>::~QStringBuilder
                      ((QStringBuilder<const_char_(&)[2],_QString> *)0x188d3b);
            QString::~QString((QString *)0x188d48);
            local_8e0 = 0xaaaaaaaaaaaaaaaa;
            local_8d8 = 0xaaaaaaaaaaaaaaaa;
            local_8d0 = 0xaaaaaaaaaaaaaaaa;
            ProKey::ProKey((ProKey *)in_stack_ffffffffffffe790,
                           (char *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
            QFileInfo::fileName();
            createSedArgs(in_stack_ffffffffffffe808,in_stack_ffffffffffffe800,
                          in_stack_ffffffffffffe7f8);
            QString::~QString((QString *)0x188dd0);
            ProKey::~ProKey((ProKey *)0x188ddd);
            bVar3 = QString::isEmpty((QString *)0x188dea);
            if (bVar3) {
              QList<QString>::operator<<
                        ((QList<QString> *)in_stack_ffffffffffffe790,
                         (parameter_type)
                         CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
            }
            else {
              local_950 = ::operator+((char (*) [8])in_stack_ffffffffffffe790,
                                      (QString *)
                                      CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788))
              ;
              local_951 = 0x20;
              ::operator+((QStringBuilder<const_char_(&)[8],_QString_&> *)in_stack_ffffffffffffe790,
                          (char *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              (**(code **)(*in_RDI + 0x60))(local_970,in_RDI,&local_518);
              ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char> *)
                          in_stack_ffffffffffffe798,(QString *)in_stack_ffffffffffffe790);
              ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>
                           *)in_stack_ffffffffffffe798,(char (*) [4])in_stack_ffffffffffffe790);
              (**(code **)(*in_RDI + 0x60))(local_988,in_RDI,&local_7c0);
              ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>
                           *)in_stack_ffffffffffffe798,(QString *)in_stack_ffffffffffffe790);
              ::QStringBuilder::operator_cast_to_QString
                        ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>,_QString>
                          *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              QList<QString>::operator<<
                        ((QList<QString> *)in_stack_ffffffffffffe790,
                         (rvalue_ref)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              QString::~QString((QString *)0x188f04);
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>,_QString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>,_QString>
                                 *)in_stack_ffffffffffffe790);
              QString::~QString((QString *)0x188f1e);
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>
                                 *)0x188f2b);
              QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>
                                 *)0x188f38);
              QString::~QString((QString *)0x188f45);
            }
            bVar2 = false;
            bVar1 = false;
            bVar3 = false;
            local_176c = 0;
            if (!bVar4) {
              QString::QString((QString *)in_stack_ffffffffffffe798,in_stack_ffffffffffffe7c8);
              bVar2 = true;
              bVar4 = QMakeProject::isActiveConfig
                                (in_stack_ffffffffffffe798,(QString *)in_stack_ffffffffffffe790,
                                 SUB41(in_stack_ffffffffffffe78c >> 0x18,0));
              local_176c = 0;
              if (!bVar4) {
                QString::QString((QString *)in_stack_ffffffffffffe798,in_stack_ffffffffffffe7c8);
                bVar1 = true;
                bVar4 = QMakeProject::isActiveConfig
                                  (in_stack_ffffffffffffe798,(QString *)in_stack_ffffffffffffe790,
                                   SUB41(in_stack_ffffffffffffe78c >> 0x18,0));
                local_176c = 0;
                if (!bVar4) {
                  uVar6 = QFileInfo::isDir();
                  local_176c = 0;
                  if ((uVar6 & 1) == 0) {
                    uVar6 = QFileInfo::isExecutable();
                    local_176c = 0;
                    if ((uVar6 & 1) != 0) {
                      in_stack_ffffffffffffe878 = (MakefileGenerator *)in_RDI[0x1b];
                      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe790,
                                     (char *)CONCAT44(in_stack_ffffffffffffe78c,
                                                      in_stack_ffffffffffffe788));
                      bVar3 = true;
                      bVar4 = QMakeProject::isEmpty
                                        (in_stack_ffffffffffffe7a8,
                                         (ProKey *)in_stack_ffffffffffffe7a0);
                      local_176c = bVar4 ^ 0xff;
                    }
                  }
                }
              }
            }
            if (bVar3) {
              ProKey::~ProKey((ProKey *)0x1890fd);
            }
            if (bVar1) {
              QString::~QString((QString *)0x189116);
            }
            if (bVar2) {
              QString::~QString((QString *)0x18912f);
            }
            if ((local_176c & 1) != 0) {
              QString::QString((QString *)in_stack_ffffffffffffe798,in_stack_ffffffffffffe7c8);
              ProKey::ProKey((ProKey *)in_stack_ffffffffffffe790,
                             (char *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              (**(code **)(*in_RDI + 0xb0))(local_ae8,in_RDI,local_b18);
              ::operator+((QString *)in_stack_ffffffffffffe798,(QString *)in_stack_ffffffffffffe790)
              ;
              ::operator+((QStringBuilder<QString,_QString> *)in_stack_ffffffffffffe798,
                          (char (*) [2])in_stack_ffffffffffffe790);
              local_b88 = ::operator+((QString *)in_stack_ffffffffffffe790,
                                      (QString *)
                                      CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788))
              ;
              ::QStringBuilder::operator_cast_to_QString
                        ((QStringBuilder<QString_&,_QString_&> *)
                         CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              QFlags<MakefileGenerator::FileFixifyType>::QFlags
                        ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffe790,
                         in_stack_ffffffffffffe78c);
              fileFixify((MakefileGenerator *)
                         CONCAT17(in_stack_ffffffffffffe847,in_stack_ffffffffffffe840),
                         in_stack_ffffffffffffe838,(FileFixifyTypes)in_stack_ffffffffffffecec.i,
                         SUB81((ulong)in_stack_ffffffffffffe830 >> 0x38,0));
              filePrefixRoot((MakefileGenerator *)in_stack_ffffffffffffe7a8,
                             (QString *)in_stack_ffffffffffffe7a0,
                             (QString *)in_stack_ffffffffffffe798);
              (**(code **)(*in_RDI + 0x60))(local_b30,in_RDI,local_b48);
              ::operator+((QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]> *)
                          in_stack_ffffffffffffe798,(QString *)in_stack_ffffffffffffe790);
              ::QStringBuilder::operator_cast_to_QString
                        ((QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                          *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              QList<QString>::operator<<
                        ((QList<QString> *)in_stack_ffffffffffffe790,
                         (rvalue_ref)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              QString::~QString((QString *)0x1892cb);
              QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>,_QString>
                                 *)in_stack_ffffffffffffe790);
              QString::~QString((QString *)0x1892e5);
              QString::~QString((QString *)0x1892f2);
              QString::~QString((QString *)0x1892ff);
              QString::~QString((QString *)0x18930c);
              QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]>::~QStringBuilder
                        ((QStringBuilder<QStringBuilder<QString,_QString>,_const_char_(&)[2]> *)
                         0x189319);
              QStringBuilder<QString,_QString>::~QStringBuilder
                        ((QStringBuilder<QString,_QString> *)in_stack_ffffffffffffe790);
              QString::~QString((QString *)0x189333);
              ProKey::~ProKey((ProKey *)0x189340);
              QString::~QString((QString *)0x18934d);
            }
            local_be0 = ::operator+((QString *)in_stack_ffffffffffffe790,
                                    (char (*) [2])
                                    CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
            local_c50 = ::operator+((QString *)in_stack_ffffffffffffe790,
                                    (QString *)
                                    CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
            ::QStringBuilder::operator_cast_to_QString
                      ((QStringBuilder<QString_&,_QString_&> *)
                       CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
            QFlags<MakefileGenerator::FileFixifyType>::QFlags
                      ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffe790,
                       in_stack_ffffffffffffe78c);
            fileFixify((MakefileGenerator *)
                       CONCAT17(in_stack_ffffffffffffe847,in_stack_ffffffffffffe840),
                       in_stack_ffffffffffffe838,(FileFixifyTypes)in_stack_ffffffffffffecec.i,
                       SUB81((ulong)in_stack_ffffffffffffe830 >> 0x38,0));
            filePrefixRoot((MakefileGenerator *)in_stack_ffffffffffffe7a8,
                           (QString *)in_stack_ffffffffffffe7a0,(QString *)in_stack_ffffffffffffe798
                          );
            (**(code **)(*in_RDI + 0x60))(local_bf8,in_RDI,local_c10);
            ::operator+((QStringBuilder<QString_&,_const_char_(&)[2]> *)in_stack_ffffffffffffe798,
                        (QString *)in_stack_ffffffffffffe790);
            ::QStringBuilder::operator_cast_to_QString
                      ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString> *)
                       CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
            QList<QString>::append
                      ((QList<QString> *)in_stack_ffffffffffffe790,
                       (rvalue_ref)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
            QString::~QString((QString *)0x18947b);
            QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString>::~QStringBuilder
                      ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString> *)
                       0x189488);
            QString::~QString((QString *)0x189495);
            QString::~QString((QString *)0x1894a2);
            QString::~QString((QString *)0x1894af);
            QString::~QString((QString *)0x1894bc);
            QString::~QString((QString *)0x1894d4);
            QString::~QString((QString *)0x1894e1);
            QString::~QString((QString *)0x1894ee);
            QFileInfo::~QFileInfo((QFileInfo *)local_790);
          }
          QString::~QString((QString *)0x18a35f);
          QString::~QString((QString *)0x18a36c);
          QString::~QString((QString *)0x18a379);
          QString::~QString((QString *)0x18a386);
          QList<QString>::iterator::operator++(local_500);
        }
        QString::~QString((QString *)0x18a3b6);
      }
      local_1308 = 0xaaaaaaaaaaaaaaaa;
      local_1300 = 0xaaaaaaaaaaaaaaaa;
      local_12f8 = 0xaaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x18a3f0);
      if (local_16b5) {
        QList<ProString>::const_iterator::operator*(local_168);
        ProString::toQString
                  ((ProString *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
        (**(code **)(*in_RDI + 0x90))(local_1320,in_RDI,local_1338);
        QString::operator=((QString *)in_stack_ffffffffffffe790,
                           (QString *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788))
        ;
        QString::~QString((QString *)0x18a45a);
        QString::~QString((QString *)0x18a467);
      }
      else {
        QString::QString((QString *)in_stack_ffffffffffffe798,in_stack_ffffffffffffe7c8);
        QListSpecialMethods<QString>::join
                  ((QListSpecialMethods<QString> *)in_stack_ffffffffffffe7a8,
                   (QString *)in_stack_ffffffffffffe7a0);
        QString::operator=((QString *)in_stack_ffffffffffffe790,
                           (QString *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788))
        ;
        QString::~QString((QString *)0x18a4bc);
        QString::~QString((QString *)0x18a4c9);
      }
      local_1380 = 0xaaaaaaaaaaaaaaaa;
      local_1378 = 0xaaaaaaaaaaaaaaaa;
      local_1370 = 0xaaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffe830 = in_RDI[0x1b];
      QList<ProString>::const_iterator::operator*(local_168);
      local_13c0 = ::operator+((ProString *)in_stack_ffffffffffffe790,
                               (char (*) [11])
                               CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
      ProKey::ProKey<ProString_const&,char_const(&)[11]>
                ((ProKey *)in_stack_ffffffffffffe790,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[11]> *)
                 CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
      in_stack_ffffffffffffe838 =
           (QString *)
           QMakeProject::values
                     (in_stack_ffffffffffffe790,
                      (ProKey *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
      QChar::QChar<char,_true>(&local_13c2,' ');
      ProStringList::join((ProStringList *)
                          CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788),
                          (QChar)(char16_t)((ulong)in_stack_ffffffffffffe798 >> 0x30));
      ProKey::~ProKey((ProKey *)0x18a5a7);
      bVar3 = QString::isEmpty((QString *)0x18a5b4);
      if (!bVar3) {
        QList<QString>::operator<<
                  ((QList<QString> *)in_stack_ffffffffffffe790,
                   (parameter_type)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
      }
      bVar3 = QString::isEmpty((QString *)0x18a5da);
      if ((bVar3) &&
         (qVar8 = QListSpecialMethodsBase<ProString>::indexOf<char[14]>
                            ((QListSpecialMethodsBase<ProString> *)in_stack_ffffffffffffe790,
                             (char (*) [14])
                             CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788),0x18a5f8)
         , qVar8 == -1)) {
        if (Option::debug_level != 0) {
          QList<ProString>::const_iterator::operator*(local_168);
          ProString::toLatin1((ProString *)in_stack_ffffffffffffe7a8);
          pcVar13 = QByteArray::constData((QByteArray *)0x18aead);
          debug_msg_internal(1,"no definition for install %s: install target not created",pcVar13);
          QByteArray::~QByteArray((QByteArray *)0x18aed0);
        }
      }
      else {
        if (((in_DL & 1) == 0) &&
           (qVar8 = QListSpecialMethodsBase<ProString>::indexOf<char[9]>
                              ((QListSpecialMethodsBase<ProString> *)in_stack_ffffffffffffe790,
                               (char (*) [9])
                               CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788),
                               0x18a624), qVar8 == -1)) {
          QString::QString((QString *)in_stack_ffffffffffffe798,in_stack_ffffffffffffe7c8);
          bVar3 = QMakeProject::isActiveConfig
                            (in_stack_ffffffffffffe798,(QString *)in_stack_ffffffffffffe790,
                             SUB41(in_stack_ffffffffffffe78c >> 0x18,0));
          QString::~QString((QString *)0x18a6cd);
          if (bVar3) {
            QTextStream::operator<<(in_RSI,"install_");
            QList<ProString>::const_iterator::operator*(local_168);
            pQVar14 = ::operator<<((QTextStream *)in_stack_ffffffffffffe7c0,
                                   (ProString *)in_stack_ffffffffffffe7b8);
            QTextStream::operator<<(pQVar14,": all");
          }
          else {
            in_stack_ffffffffffffe808 =
                 (MakefileGenerator *)QTextStream::operator<<(in_RSI,"install_");
            QList<ProString>::const_iterator::operator*(local_168);
            pQVar14 = ::operator<<((QTextStream *)in_stack_ffffffffffffe7c0,
                                   (ProString *)in_stack_ffffffffffffe7b8);
            QTextStream::operator<<(pQVar14,": first");
          }
        }
        else {
          QTextStream::operator<<(in_RSI,"install_");
          QList<ProString>::const_iterator::operator*(local_168);
          pQVar14 = ::operator<<((QTextStream *)in_stack_ffffffffffffe7c0,
                                 (ProString *)in_stack_ffffffffffffe7b8);
          QTextStream::operator<<(pQVar14,":");
        }
        in_stack_ffffffffffffe7f8 = (QString *)in_RDI[0x1b];
        QList<ProString>::const_iterator::operator*(local_168);
        local_1420 = ::operator+((ProString *)in_stack_ffffffffffffe790,
                                 (char (*) [9])
                                 CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
        ProKey::ProKey<ProString_const&,char_const(&)[9]>
                  ((ProKey *)in_stack_ffffffffffffe790,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[9]> *)
                   CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
        in_stack_ffffffffffffe800 =
             (ProKey *)
             QMakeProject::values
                       (in_stack_ffffffffffffe790,
                        (ProKey *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
        ProKey::~ProKey((ProKey *)0x18a7f9);
        bVar3 = QList<ProString>::isEmpty((QList<ProString> *)0x18a813);
        if (!bVar3) {
          local_1428.i = (ProString *)0xaaaaaaaaaaaaaaaa;
          local_1428 = QList<ProString>::begin((QList<ProString> *)in_stack_ffffffffffffe790);
          while( true ) {
            cVar7 = QList<ProString>::end((QList<ProString> *)in_stack_ffffffffffffe790);
            bVar3 = QList<ProString>::const_iterator::operator!=(&local_1428,cVar7);
            if (!bVar3) break;
            local_1440 = 0xaaaaaaaaaaaaaaaa;
            local_1438 = 0xaaaaaaaaaaaaaaaa;
            local_1430 = 0xaaaaaaaaaaaaaaaa;
            QList<ProString>::const_iterator::operator*(&local_1428);
            local_1480 = ::operator+((ProString *)in_stack_ffffffffffffe790,
                                     (char (*) [8])
                                     CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
            ProKey::ProKey<ProString_const&,char_const(&)[8]>
                      ((ProKey *)in_stack_ffffffffffffe790,
                       (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)
                       CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
            (**(code **)(*in_RDI + 0xb0))(&local_1440,in_RDI,local_1470);
            ProKey::~ProKey((ProKey *)0x18a90e);
            bVar3 = QString::isEmpty((QString *)0x18a91b);
            if (bVar3) {
              QList<ProString>::const_iterator::operator*(&local_1428);
              ProString::toQString
                        ((ProString *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788))
              ;
              QString::operator=((QString *)in_stack_ffffffffffffe790,
                                 (QString *)
                                 CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
              QString::~QString((QString *)0x18a960);
            }
            pQVar14 = (QTextStream *)QTextStream::operator<<(in_RSI," ");
            (**(code **)(*in_RDI + 0x68))(local_14b0,in_RDI,&local_1440);
            QTextStream::operator<<(pQVar14,(QString *)local_14b0);
            QString::~QString((QString *)0x18a9b6);
            QString::~QString((QString *)0x18a9c3);
            QList<ProString>::const_iterator::operator++(&local_1428);
          }
        }
        QTextStream::operator<<(in_RSI," FORCE\n\t");
        QMakeProject::values
                  (in_stack_ffffffffffffe790,
                   (ProKey *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
        local_14b8.i = (ProString *)0xaaaaaaaaaaaaaaaa;
        local_14b8 = QList<ProString>::begin((QList<ProString> *)in_stack_ffffffffffffe790);
        while( true ) {
          cVar7 = QList<ProString>::end((QList<ProString> *)in_stack_ffffffffffffe790);
          bVar3 = QList<ProString>::const_iterator::operator!=(&local_14b8,cVar7);
          if (!bVar3) break;
          local_14d0 = 0xaaaaaaaaaaaaaaaa;
          local_14c8 = 0xaaaaaaaaaaaaaaaa;
          local_14c0 = 0xaaaaaaaaaaaaaaaa;
          QList<ProString>::const_iterator::operator*(&local_14b8);
          ProString::toQString
                    ((ProString *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
          QFlags<MakefileGenerator::FileFixifyType>::QFlags
                    ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffe790,
                     in_stack_ffffffffffffe78c);
          fileFixify((MakefileGenerator *)
                     CONCAT17(in_stack_ffffffffffffe847,in_stack_ffffffffffffe840),
                     in_stack_ffffffffffffe838,(FileFixifyTypes)in_stack_ffffffffffffecec.i,
                     SUB81((ulong)in_stack_ffffffffffffe830 >> 0x38,0));
          QString::~QString((QString *)0x18ab08);
          in_stack_ffffffffffffe7e8 = in_RSI;
          filePrefixRoot((MakefileGenerator *)in_stack_ffffffffffffe7a8,
                         (QString *)in_stack_ffffffffffffe7a0,(QString *)in_stack_ffffffffffffe798);
          mkdir_p_asstring(in_stack_ffffffffffffe7b0,(QString *)in_stack_ffffffffffffe7a8,
                           SUB81((ulong)in_stack_ffffffffffffe7a0 >> 0x38,0));
          pQVar14 = (QTextStream *)
                    QTextStream::operator<<(in_stack_ffffffffffffe7e8,(QString *)local_1508);
          QTextStream::operator<<(pQVar14,"\n\t");
          QString::~QString((QString *)0x18ab8a);
          QString::~QString((QString *)0x18ab97);
          QString::~QString((QString *)0x18aba4);
          QList<ProString>::const_iterator::operator++(&local_14b8);
        }
        QTextStream::operator<<(in_RSI,(QString *)&local_1308);
        ::operator<<((QTextStream *)in_stack_ffffffffffffe790,
                     (QTextStreamFunction)
                     CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
        ::operator<<((QTextStream *)in_stack_ffffffffffffe790,
                     (QTextStreamFunction)
                     CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
        bVar3 = QList<QString>::isEmpty((QList<QString> *)0x18abf6);
        if (!bVar3) {
          QTextStream::operator<<(in_RSI,"uninstall_");
          QList<ProString>::const_iterator::operator*(local_168);
          pQVar14 = ::operator<<((QTextStream *)in_stack_ffffffffffffe7c0,
                                 (ProString *)in_stack_ffffffffffffe7b8);
          QTextStream::operator<<(pQVar14,": FORCE");
          qVar8 = QList<QString>::size(&local_2e0);
          local_1704 = (int)qVar8;
          while (local_1704 = local_1704 + -1, -1 < local_1704) {
            pQVar14 = (QTextStream *)QTextStream::operator<<(in_RSI,"\n\t");
            pQVar12 = QList<QString>::at((QList<QString> *)in_stack_ffffffffffffe790,
                                         CONCAT44(in_stack_ffffffffffffe78c,
                                                  in_stack_ffffffffffffe788));
            QTextStream::operator<<(pQVar14,(QString *)pQVar12);
          }
          pQVar14 = (QTextStream *)QTextStream::operator<<(in_RSI,"\n\t-$(DEL_DIR) ");
          filePrefixRoot((MakefileGenerator *)in_stack_ffffffffffffe7a8,
                         (QString *)in_stack_ffffffffffffe7a0,(QString *)in_stack_ffffffffffffe798);
          (**(code **)(*in_RDI + 0x60))(local_1538,in_RDI,local_1550);
          pQVar14 = (QTextStream *)QTextStream::operator<<(pQVar14,(QString *)local_1538);
          QTextStream::operator<<(pQVar14," \n\n");
          QString::~QString((QString *)0x18ad31);
          QString::~QString((QString *)0x18ad3e);
        }
        ::operator<<((QTextStream *)in_stack_ffffffffffffe790,
                     (QTextStreamFunction)
                     CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
        qVar8 = QListSpecialMethodsBase<ProString>::indexOf<char[19]>
                          ((QListSpecialMethodsBase<ProString> *)in_stack_ffffffffffffe790,
                           (char (*) [19])
                           CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788),0x18ad6a);
        if (qVar8 == -1) {
          QString::QString((QString *)in_stack_ffffffffffffe798,in_stack_ffffffffffffe7c8);
          QList<ProString>::const_iterator::operator*(local_168);
          ::operator+((QString *)in_stack_ffffffffffffe798,(ProString *)in_stack_ffffffffffffe790);
          ::operator+((QStringBuilder<QString,_const_ProString_&> *)in_stack_ffffffffffffe798,
                      (char (*) [2])in_stack_ffffffffffffe790);
          ::operator+=((QString *)in_stack_ffffffffffffe7c0,
                       (QStringBuilder<QStringBuilder<QString,_const_ProString_&>,_const_char_(&)[2]>
                        *)in_stack_ffffffffffffe7b8);
          QStringBuilder<QStringBuilder<QString,_const_ProString_&>,_const_char_(&)[2]>::
          ~QStringBuilder((QStringBuilder<QStringBuilder<QString,_const_ProString_&>,_const_char_(&)[2]>
                           *)0x18adeb);
          QStringBuilder<QString,_const_ProString_&>::~QStringBuilder
                    ((QStringBuilder<QString,_const_ProString_&> *)0x18adf8);
          QString::~QString((QString *)0x18ae05);
          bVar3 = QList<QString>::isEmpty((QList<QString> *)0x18ae12);
          if (!bVar3) {
            QList<ProString>::const_iterator::operator*(local_168);
            local_15d8 = ::operator+((char (*) [11])in_stack_ffffffffffffe790,
                                     (ProString *)
                                     CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
            ::operator+((QStringBuilder<const_char_(&)[11],_const_ProString_&> *)
                        in_stack_ffffffffffffe790,
                        (char (*) [2])CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788))
            ;
            ::operator+=((QString *)in_stack_ffffffffffffe7c0,
                         (QStringBuilder<QStringBuilder<const_char_(&)[11],_const_ProString_&>,_const_char_(&)[2]>
                          *)in_stack_ffffffffffffe7b8);
          }
        }
      }
      QString::~QString((QString *)0x18aedf);
      QString::~QString((QString *)0x18aeec);
      ProStringList::~ProStringList((ProStringList *)0x18aef9);
      QList<QString>::~QList((QList<QString> *)0x18af06);
      QList<QString>::~QList((QList<QString> *)0x18af13);
      QList<QString>::~QList((QList<QString> *)0x18af20);
      QString::~QString((QString *)0x18af2d);
      QString::~QString((QString *)0x18af3a);
    }
    ProKey::~ProKey((ProKey *)0x18af52);
    QList<ProString>::const_iterator::operator++(local_168);
  } while( true );
}

Assistant:

void
MakefileGenerator::writeInstalls(QTextStream &t, bool noBuild)
{
    QString rm_dir_contents("-$(DEL_FILE)");
    if (!isWindowsShell()) //ick
        rm_dir_contents = "-$(DEL_FILE) -r";

    QString all_installs, all_uninstalls;
    QSet<QString> made_dirs, removed_dirs;
    const ProStringList &l = project->values("INSTALLS");
    for (ProStringList::ConstIterator it = l.begin(); it != l.end(); ++it) {
        const ProKey pvar(*it + ".path");
        const ProStringList &installConfigValues = project->values(ProKey(*it + ".CONFIG"));
        if (installConfigValues.indexOf("no_path") == -1 &&
            installConfigValues.indexOf("dummy_install") == -1 &&
           project->values(pvar).isEmpty()) {
            warn_msg(WarnLogic, "%s is not defined: install target not created\n", pvar.toLatin1().constData());
            continue;
        }

        bool do_default = true;
        const QString root = installRoot();
        QString dst;
        if (installConfigValues.indexOf("no_path") == -1 &&
            installConfigValues.indexOf("dummy_install") == -1) {
            dst = fileFixify(project->first(pvar).toQString(), FileFixifyAbsolute, false);
            if(!dst.endsWith(Option::dir_sep))
                dst += Option::dir_sep;
        }

        QStringList tmp, inst, uninst;
        //other
        ProStringList tmp2 = project->values(ProKey(*it + ".extra"));
        if (tmp2.isEmpty())
            tmp2 = project->values(ProKey(*it + ".commands")); //to allow compatible name
        if (!tmp2.isEmpty()) {
            do_default = false;
            inst << tmp2.join(' ');
        }
        //masks
        tmp2 = findFilesInVPATH(project->values(ProKey(*it + ".files")), VPATH_NoFixify);
        tmp = fileFixify(tmp2.toQStringList(), FileFixifyAbsolute);
        if(!tmp.isEmpty()) {
            do_default = false;
            QString base_path = project->first(ProKey(*it + ".base")).toQString();
            if (!base_path.isEmpty()) {
                base_path = Option::fixPathToTargetOS(base_path, false, true);
                if (!base_path.endsWith(Option::dir_sep))
                    base_path += Option::dir_sep;
            }
            for(QStringList::Iterator wild_it = tmp.begin(); wild_it != tmp.end(); ++wild_it) {
                QString wild = Option::fixPathToTargetOS((*wild_it), false, false);
                QString dirstr = qmake_getpwd(), filestr = wild;
                int slsh = filestr.lastIndexOf(Option::dir_sep);
                if(slsh != -1) {
                    dirstr = filestr.left(slsh+1);
                    filestr.remove(0, slsh+1);
                }
                if(!dirstr.endsWith(Option::dir_sep))
                    dirstr += Option::dir_sep;
                QString dst_dir = dst;
                if (!base_path.isEmpty()) {
                    if (!dirstr.startsWith(base_path)) {
                        warn_msg(WarnLogic, "File %s in install rule %s does not start with base %s",
                                            qPrintable(wild), qPrintable((*it).toQString()),
                                            qPrintable(base_path));
                    } else {
                        QString dir_sfx = dirstr.mid(base_path.size());
                        dst_dir += dir_sfx;
                        if (!dir_sfx.isEmpty() && !made_dirs.contains(dir_sfx)) {
                            made_dirs.insert(dir_sfx);
                            QString tmp_dst = fileFixify(dst_dir, FileFixifyAbsolute, false);
                            tmp_dst.chop(1);
                            inst << mkdir_p_asstring(filePrefixRoot(root, tmp_dst));
                            for (int i = dst.size(); i < dst_dir.size(); i++) {
                                if (dst_dir.at(i) == Option::dir_sep) {
                                    QString subd = dst_dir.left(i);
                                    if (!removed_dirs.contains(subd)) {
                                        removed_dirs.insert(subd);
                                        tmp_dst = fileFixify(subd, FileFixifyAbsolute, false);
                                        uninst << "-$(DEL_DIR) "
                                                  + escapeFilePath(filePrefixRoot(root, tmp_dst));
                                    }
                                }
                            }
                        }
                    }
                }
                bool is_target = (wild == fileFixify(var("TARGET"), FileFixifyAbsolute));
                const bool noStrip = installConfigValues.contains("nostrip");
                if(is_target || exists(wild)) { //real file or target
                    QFileInfo fi(fileInfo(wild));
                    QString dst_file = filePrefixRoot(root, dst_dir);
                    if (!dst_file.endsWith(Option::dir_sep))
                        dst_file += Option::dir_sep;
                    dst_file += fi.fileName();
                    QString cmd;
                    if (is_target || (!fi.isDir() && fi.isExecutable()))
                       cmd = QLatin1String("$(QINSTALL_PROGRAM)");
                    else
                       cmd = QLatin1String("$(QINSTALL)");
                    cmd += " " + escapeFilePath(wild) + " " + escapeFilePath(dst_file);

                    QString sedArgs = createSedArgs(ProKey("QMAKE_INSTALL_REPLACE"), fi.fileName());
                    if (!sedArgs.isEmpty())
                        inst << "$(SED) " + sedArgs + ' ' + escapeFilePath(wild) + " > "
                                        + escapeFilePath(dst_file);
                    else
                        inst << cmd;

                    if (!noStrip && !project->isActiveConfig("debug_info") && !project->isActiveConfig("nostrip") &&
                       !fi.isDir() && fi.isExecutable() && !project->isEmpty("QMAKE_STRIP"))
                        inst << QString("-") + var("QMAKE_STRIP") + " " +
                                  escapeFilePath(filePrefixRoot(root, fileFixify(dst_dir + filestr, FileFixifyAbsolute, false)));
                    uninst.append(rm_dir_contents + " " + escapeFilePath(filePrefixRoot(root, fileFixify(dst_dir + filestr, FileFixifyAbsolute, false))));
                    continue;
                }
                QString local_dirstr = Option::normalizePath(dirstr);
                QStringList files = QDir(local_dirstr).entryList(QStringList(filestr),
                                            QDir::NoDotAndDotDot | QDir::AllEntries);
                if (installConfigValues.contains("no_check_exist") && files.isEmpty()) {
                    QString dst_file = filePrefixRoot(root, dst_dir);
                    if (!dst_file.endsWith(Option::dir_sep))
                        dst_file += Option::dir_sep;
                    dst_file += filestr;
                    QString cmd;
                    if (installConfigValues.contains("executable"))
                        cmd = QLatin1String("$(QINSTALL_PROGRAM)");
                    else
                        cmd = QLatin1String("$(QINSTALL)");
                    cmd += " " + escapeFilePath(wild) + " " + escapeFilePath(dst_file);
                    inst << cmd;
                    uninst.append(rm_dir_contents + " " + escapeFilePath(filePrefixRoot(root, fileFixify(dst_dir + filestr, FileFixifyAbsolute, false))));
                }
                for(int x = 0; x < files.size(); x++) {
                    QString file = files[x];
                    uninst.append(rm_dir_contents + " " + escapeFilePath(filePrefixRoot(root, fileFixify(dst_dir + file, FileFixifyAbsolute, false))));
                    QFileInfo fi(fileInfo(dirstr + file));
                    QString dst_file = filePrefixRoot(root, fileFixify(dst_dir, FileFixifyAbsolute, false));
                    if (!dst_file.endsWith(Option::dir_sep))
                        dst_file += Option::dir_sep;
                    dst_file += fi.fileName();
                    QString cmd = QLatin1String("$(QINSTALL) ") +
                                  escapeFilePath(dirstr + file) + " " + escapeFilePath(dst_file);
                    inst << cmd;
                    if (!noStrip && !project->isActiveConfig("debug_info") && !project->isActiveConfig("nostrip") &&
                       !fi.isDir() && fi.isExecutable() && !project->isEmpty("QMAKE_STRIP"))
                        inst << QString("-") + var("QMAKE_STRIP") + " " +
                                  escapeFilePath(filePrefixRoot(root, fileFixify(dst_dir + file, FileFixifyAbsolute, false)));
                }
            }
        }
        QString target;
        //default?
        if (do_default)
            target = defaultInstall((*it).toQString());
        else
            target = inst.join("\n\t");
        QString puninst = project->values(ProKey(*it + ".uninstall")).join(' ');
        if (!puninst.isEmpty())
            uninst << puninst;

        if (!target.isEmpty() || installConfigValues.indexOf("dummy_install") != -1) {
            if (noBuild || installConfigValues.indexOf("no_build") != -1)
                t << "install_" << (*it) << ":";
            else if(project->isActiveConfig("build_all"))
                t << "install_" << (*it) << ": all";
            else
                t << "install_" << (*it) << ": first";
            const ProStringList &deps = project->values(ProKey(*it + ".depends"));
            if(!deps.isEmpty()) {
                for (ProStringList::ConstIterator dep_it = deps.begin(); dep_it != deps.end(); ++dep_it) {
                    QString targ = var(ProKey(*dep_it + ".target"));
                    if(targ.isEmpty())
                        targ = (*dep_it).toQString();
                    t << " " << escapeDependencyPath(targ);
                }
            }
            t << " FORCE\n\t";
            const ProStringList &dirs = project->values(pvar);
            for (ProStringList::ConstIterator pit = dirs.begin(); pit != dirs.end(); ++pit) {
                QString tmp_dst = fileFixify((*pit).toQString(), FileFixifyAbsolute, false);
                t << mkdir_p_asstring(filePrefixRoot(root, tmp_dst)) << "\n\t";
            }
            t << target << Qt::endl << Qt::endl;
            if(!uninst.isEmpty()) {
                t << "uninstall_" << (*it) << ": FORCE";
                for (int i = uninst.size(); --i >= 0; )
                    t << "\n\t" << uninst.at(i);
                t << "\n\t-$(DEL_DIR) " << escapeFilePath(filePrefixRoot(root, dst)) << " \n\n";
            }
            t << Qt::endl;

            if (installConfigValues.indexOf("no_default_install") == -1) {
                all_installs += QString("install_") + (*it) + " ";
                if(!uninst.isEmpty())
                    all_uninstalls += "uninstall_" + (*it) + " ";
            }
        }   else {
            debug_msg(1, "no definition for install %s: install target not created",(*it).toLatin1().constData());
        }
    }
    t << "install:" << depVar("INSTALLDEPS") << ' ' << all_installs
      << " FORCE\n\nuninstall: " << all_uninstalls << depVar("UNINSTALLDEPS")
      << " FORCE\n\n";
}